

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall kj::Path::Path(Path *this,Array<kj::String> *partsParam)

{
  String *pSVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  long lVar4;
  size_t in_RDX;
  size_t extraout_RDX;
  Path *this_00;
  long lVar5;
  StringPtr part;
  
  pSVar1 = partsParam->ptr;
  sVar2 = partsParam->size_;
  pAVar3 = partsParam->disposer;
  partsParam->ptr = (String *)0x0;
  partsParam->size_ = 0;
  (this->parts).ptr = pSVar1;
  (this->parts).size_ = sVar2;
  (this->parts).disposer = pAVar3;
  if (sVar2 != 0) {
    lVar5 = 0;
    do {
      lVar4 = *(long *)((long)&(pSVar1->content).size_ + lVar5);
      this_00 = (Path *)0x203442;
      if (lVar4 != 0) {
        this_00 = *(Path **)((long)&(pSVar1->content).ptr + lVar5);
      }
      part.content.ptr = (char *)(lVar4 + (ulong)(lVar4 == 0));
      part.content.size_ = in_RDX;
      validatePart(this_00,part);
      lVar5 = lVar5 + 0x18;
      in_RDX = extraout_RDX;
    } while (sVar2 * 0x18 != lVar5);
  }
  return;
}

Assistant:

String PathPtr::toString(bool absolute) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    return absolute ? kj::str("/") : kj::str(".");
  }

  size_t size = absolute + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = kj::heapString(size);

  char* ptr = result.begin();
  bool leadingSlash = absolute;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '/';
    leadingSlash = true;
    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  }
  KJ_ASSERT(ptr == result.end());

  return result;
}